

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O1

int Ivy_FraigSelectBestPat(Ivy_FraigMan_t *p)

{
  Vec_Ptr_t *pVVar1;
  void **ppvVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  
  if (p->nSimWords < 1) {
    iVar5 = -1;
    iVar9 = 0;
  }
  else {
    uVar4 = p->nSimWords * 0x20;
    uVar3 = 2;
    if (2 < (int)uVar4) {
      uVar3 = (ulong)uVar4;
    }
    uVar6 = 0xffffffff;
    uVar7 = 1;
    iVar8 = 0;
    do {
      iVar5 = p->pPatScores[uVar7];
      iVar9 = iVar8;
      if (iVar8 <= iVar5) {
        iVar9 = iVar5;
      }
      if (iVar8 < iVar5) {
        uVar6 = uVar7 & 0xffffffff;
      }
      iVar5 = (int)uVar6;
      uVar7 = uVar7 + 1;
      iVar8 = iVar9;
    } while (uVar3 != uVar7);
  }
  iVar8 = 0;
  if (iVar9 != 0) {
    memset(p->pPatWords,0,(long)p->nPatWords << 2);
    pVVar1 = p->pManAig->vPis;
    iVar8 = iVar9;
    if (0 < pVVar1->nSize) {
      ppvVar2 = pVVar1->pArray;
      uVar3 = 0;
      do {
        if ((*(uint *)(*(long *)((long)ppvVar2[uVar3] + 0x20) + 0x20 + (long)(iVar5 >> 5) * 4) &
            1 << ((byte)iVar5 & 0x1f)) != 0) {
          p->pPatWords[uVar3 >> 5 & 0x7ffffff] =
               p->pPatWords[uVar3 >> 5 & 0x7ffffff] | 1 << ((byte)uVar3 & 0x1f);
        }
        uVar3 = uVar3 + 1;
      } while ((long)uVar3 < (long)pVVar1->nSize);
    }
  }
  return iVar8;
}

Assistant:

int Ivy_FraigSelectBestPat( Ivy_FraigMan_t * p )
{
    Ivy_FraigSim_t * pSims;
    Ivy_Obj_t * pObj;
    int i, nLimit = p->nSimWords * 32, MaxScore = 0, BestPat = -1;
    for ( i = 1; i < nLimit; i++ )
    {
        if ( MaxScore < p->pPatScores[i] )
        {
            MaxScore = p->pPatScores[i];
            BestPat = i;
        }
    }
    if ( MaxScore == 0 )
        return 0;
//    if ( MaxScore > p->pParams->MaxScore )
//    printf( "Max score is %3d.  ", MaxScore );
    // copy the best pattern into the selected pattern
    memset( p->pPatWords, 0, sizeof(unsigned) * p->nPatWords );
    Ivy_ManForEachPi( p->pManAig, pObj, i )
    {
        pSims = Ivy_ObjSim(pObj);
        if ( Ivy_InfoHasBit(pSims->pData, BestPat) )
            Ivy_InfoSetBit(p->pPatWords, i);
    }
    return MaxScore;
}